

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

bool __thiscall
QAbstractProxyModel::setHeaderData
          (QAbstractProxyModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  int iVar1;
  arrow_operator_result ppQVar2;
  undefined8 in_RCX;
  uint in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  int sourceSection;
  QAbstractProxyModelPrivate *d;
  QModelIndex proxyIndex_1;
  QModelIndex proxyIndex;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  uint local_c4;
  QModelIndex local_98;
  undefined1 local_80 [24];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QModelIndex local_50;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QAbstractProxyModel *)0x853432);
  if (in_EDX == 1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x85348c);
    (**(code **)(*in_RDI + 0x60))(&local_20,in_RDI,0,in_ESI,local_38);
    (**(code **)(*in_RDI + 400))(&local_50,in_RDI,&local_20);
    local_c4 = QModelIndex::column(&local_50);
  }
  else {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x853520);
    (**(code **)(*in_RDI + 0x60))(&local_68,in_RDI,in_ESI,0,local_80);
    (**(code **)(*in_RDI + 400))(&local_98,in_RDI,&local_68);
    local_c4 = QModelIndex::row(&local_98);
  }
  ppQVar2 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                          *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  iVar1 = (*((*ppQVar2)->super_QObject)._vptr_QObject[0x15])
                    (*ppQVar2,(ulong)local_c4,(ulong)in_EDX,in_RCX,(ulong)in_R8D);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)((byte)iVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractProxyModel::setHeaderData(int section, Qt::Orientation orientation, const QVariant &value, int role)
{
    Q_D(QAbstractProxyModel);
    int sourceSection;
    if (orientation == Qt::Horizontal) {
        const QModelIndex proxyIndex = index(0, section);
        sourceSection = mapToSource(proxyIndex).column();
    } else {
        const QModelIndex proxyIndex = index(section, 0);
        sourceSection = mapToSource(proxyIndex).row();
    }
    return d->model->setHeaderData(sourceSection, orientation, value, role);
}